

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcsrc.cpp
# Opt level: O0

void __thiscall
CTcSrcMemory::CTcSrcMemory(CTcSrcMemory *this,char *buf,size_t len,CCharmapToUni *mapper)

{
  _func_int **pp_Var1;
  long *in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  CTcSrcObject *in_RDI;
  char *p;
  size_t alo_len;
  _func_int **local_30;
  long local_28;
  long *local_20;
  long local_18;
  undefined8 local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  CTcSrcObject::CTcSrcObject(in_RDI);
  in_RDI->_vptr_CTcSrcObject = (_func_int **)&PTR__CTcSrcMemory_003d6d78;
  local_28 = local_18 * 3;
  pp_Var1 = (_func_int **)malloc(local_28 + 1);
  in_RDI[1]._vptr_CTcSrcObject = pp_Var1;
  local_30 = in_RDI[1]._vptr_CTcSrcObject;
  (**(code **)(*local_20 + 0x20))(local_20,&local_30,&local_28,local_10,local_18);
  *(undefined1 *)local_30 = 0;
  in_RDI[2]._vptr_CTcSrcObject = in_RDI[1]._vptr_CTcSrcObject;
  return;
}

Assistant:

CTcSrcMemory::CTcSrcMemory(const char *buf, size_t len, CCharmapToUni *mapper)
{
    /* 
     *   Allocate a buffer for a UTF8-encoded copy of the buffer -
     *   allocate three bytes per byte of the original, since this is the
     *   worst case for expansion of the encoding.  Allocate one extra
     *   byte to ensure we have space for a null terminator.  
     */
    size_t alo_len = len*3;
    buf_alo_ = (char *)t3malloc(alo_len + 1);

    /* map the buffer */
    char *p = buf_alo_;
    mapper->map(&p, &alo_len, buf, len);

    /* null-terminate the translated buffer */
    *p = '\0';

    /* start reading at the start of the translated buffer */
    buf_ = buf_alo_;
}